

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O0

bool __thiscall
tchecker::algorithms::ndfs::
algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t>::accepting
          (algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this,
          node_sptr_t *n,zg_t *ts,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  bool bVar1;
  bool local_6e;
  node_zg_state_t local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels_local;
  zg_t *ts_local;
  node_sptr_t *n_local;
  algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_ndfs::graph_t> *this_local;
  
  local_30 = labels;
  labels_local = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)ts;
  ts_local = (zg_t *)n;
  n_local = (node_sptr_t *)this;
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none(labels);
  this_01 = labels_local;
  this_00 = local_30;
  local_6e = false;
  if (!bVar1) {
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
    ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)ts_local);
    tchecker::graph::node_zg_state_t::state_ptr(&local_58);
    zg::zg_t::labels(&local_50,(zg_t *)this_01,&local_58._state);
    local_6e = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                         (this_00,&local_50);
  }
  this_local._7_1_ = local_6e;
  if (!bVar1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_50)
    ;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_58._state);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool accepting(node_sptr_t const & n, TS & ts, boost::dynamic_bitset<> const & labels) const
  {
    return !labels.none() && labels.is_subset_of(ts.labels(n->state_ptr()));
  }